

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O2

void __thiscall
tchecker::syncprod::transition_t::transition_t
          (transition_t *this,transition_t *t,sync_id_t sync_id,
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
          *vedge)

{
  vedge_sptr_t *this_00;
  uint __line;
  bool bVar1;
  vedge_t *vedge_00;
  char *__assertion;
  
  this->_sync_id = sync_id;
  this_00 = &this->_vedge;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
  intrusive_shared_ptr_t(this_00,vedge);
  if (this->_sync_id == 0xffffffff) {
    vedge_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
                ::operator*(this_00)->super_vedge_t;
    bVar1 = is_asynchronous(vedge_00);
    if (!bVar1) {
      __assertion = "(_sync_id != tchecker::NO_SYNC) || tchecker::is_asynchronous(*_vedge)";
      __line = 0x24;
      goto LAB_0016670e;
    }
  }
  if (this_00->_t != (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0) {
    return;
  }
  __assertion = "_vedge.ptr() != nullptr";
  __line = 0x25;
LAB_0016670e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/syncprod/transition.cc"
                ,__line,
                "tchecker::syncprod::transition_t::transition_t(const tchecker::syncprod::transition_t &, tchecker::sync_id_t, const tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> &)"
               );
}

Assistant:

transition_t::transition_t(tchecker::syncprod::transition_t const & t, tchecker::sync_id_t sync_id,
                           tchecker::intrusive_shared_ptr_t<tchecker::shared_vedge_t> const & vedge)
    : tchecker::ts::transition_t(t), _sync_id(sync_id), _vedge(vedge)
{
  assert((_sync_id != tchecker::NO_SYNC) || tchecker::is_asynchronous(*_vedge));
  assert(_vedge.ptr() != nullptr);
}